

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceMgr.cpp
# Opt level: O1

void __thiscall
llvm::SMDiagnostic::print
          (SMDiagnostic *this,char *ProgName,raw_ostream *OS,bool ShowColors,bool ShowKindLabel)

{
  string *psVar1;
  byte bVar2;
  char *pcVar3;
  long lVar4;
  ulong uVar5;
  undefined1 *puVar6;
  uint uVar7;
  StringRef LineContents;
  undefined8 uVar8;
  int iVar9;
  uint uVar10;
  ulong uVar11;
  size_type sVar12;
  pointer pcVar13;
  bool bVar14;
  char *pcVar15;
  ulong uVar16;
  byte *pbVar17;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  char *pcVar18;
  _Alloc_hider _Var19;
  size_t sVar20;
  byte *extraout_RDX_01;
  byte *extraout_RDX_02;
  byte *extraout_RDX_03;
  byte *extraout_RDX_04;
  byte *extraout_RDX_05;
  byte *pbVar21;
  byte *extraout_RDX_06;
  long lVar22;
  undefined1 DisableColors;
  uint uVar23;
  size_t i;
  long lVar24;
  size_t OutCol;
  ulong uVar25;
  ulong uVar26;
  StringRef Str;
  StringRef Str_00;
  StringRef Str_01;
  StringRef Chars;
  size_type *local_98;
  string FixItInsertionLine;
  WithColor S_1;
  undefined1 local_58 [8];
  string CaretLine;
  
  bVar14 = !ShowColors;
  CaretLine._M_dataplus._M_p = (pointer)(CONCAT71(CaretLine._M_dataplus._M_p._1_7_,ShowColors) ^ 1);
  pcVar18 = (char *)0x0;
  DisableColors = ShowKindLabel;
  local_58 = (undefined1  [8])OS;
  WithColor::changeColor((WithColor *)local_58,SAVEDCOLOR,true,false);
  if ((ProgName != (char *)0x0) && (*ProgName != '\0')) {
    raw_ostream::operator<<((raw_ostream *)local_58,ProgName);
    Str.Length = 2;
    Str.Data = ": ";
    raw_ostream::operator<<((raw_ostream *)local_58,Str);
  }
  if ((this->Filename)._M_string_length != 0) {
    iVar9 = std::__cxx11::string::compare((char *)&this->Filename);
    if (iVar9 == 0) {
      Str_00.Length = 7;
      Str_00.Data = "<stdin>";
      raw_ostream::operator<<((raw_ostream *)local_58,Str_00);
      __buf = extraout_RDX_00;
    }
    else {
      raw_ostream::write((raw_ostream *)local_58,(int)(this->Filename)._M_dataplus._M_p,
                         (void *)(this->Filename)._M_string_length,(size_t)pcVar18);
      __buf = extraout_RDX;
    }
    if (this->LineNo != -1) {
      pcVar3 = *(char **)((long)local_58 + 0x18);
      if (pcVar3 < *(char **)((long)local_58 + 0x10)) {
        pcVar18 = pcVar3 + 1;
        *(char **)((long)local_58 + 0x18) = pcVar18;
        *pcVar3 = ':';
      }
      else {
        raw_ostream::write((raw_ostream *)local_58,0x3a,__buf,(size_t)pcVar18);
      }
      raw_ostream::operator<<((raw_ostream *)local_58,(long)this->LineNo);
      if (this->ColumnNo != -1) {
        pcVar3 = *(char **)((long)local_58 + 0x18);
        if (pcVar3 < *(char **)((long)local_58 + 0x10)) {
          *(char **)((long)local_58 + 0x18) = pcVar3 + 1;
          *pcVar3 = ':';
        }
        else {
          raw_ostream::write((raw_ostream *)local_58,0x3a,__buf_00,(size_t)pcVar18);
        }
        raw_ostream::operator<<((raw_ostream *)local_58,(long)this->ColumnNo + 1);
      }
    }
    Str_01.Length = 2;
    Str_01.Data = ": ";
    raw_ostream::operator<<((raw_ostream *)local_58,Str_01);
  }
  WithColor::~WithColor((WithColor *)local_58);
  if (ShowKindLabel) {
    switch(this->Kind) {
    case DK_Error:
      WithColor::error((WithColor *)OS,(raw_ostream *)0xe85cd6,(StringRef)(ZEXT116(bVar14) << 0x40),
                       (bool)DisableColors);
      break;
    case DK_Warning:
      WithColor::warning((WithColor *)OS,(raw_ostream *)0xe85cd6,
                         (StringRef)(ZEXT116(bVar14) << 0x40),(bool)DisableColors);
      break;
    case DK_Remark:
      WithColor::remark((WithColor *)OS,(raw_ostream *)0xe85cd6,(StringRef)(ZEXT116(bVar14) << 0x40)
                        ,(bool)DisableColors);
      break;
    case DK_Note:
      WithColor::note((WithColor *)OS,(raw_ostream *)0xe85cd6,(StringRef)(ZEXT116(bVar14) << 0x40),
                      (bool)DisableColors);
    }
  }
  CaretLine._M_dataplus._M_p = (pointer)(CONCAT71(CaretLine._M_dataplus._M_p._1_7_,ShowColors) ^ 1);
  sVar20 = 0;
  local_58 = (undefined1  [8])OS;
  WithColor::changeColor((WithColor *)local_58,SAVEDCOLOR,true,false);
  raw_ostream::write((raw_ostream *)local_58,(int)(this->Message)._M_dataplus._M_p,
                     (void *)(this->Message)._M_string_length,sVar20);
  pcVar18 = *(char **)((long)local_58 + 0x18);
  if (pcVar18 < *(char **)((long)local_58 + 0x10)) {
    *(char **)((long)local_58 + 0x18) = pcVar18 + 1;
    *pcVar18 = '\n';
  }
  else {
    raw_ostream::write((raw_ostream *)local_58,10,__buf_01,sVar20);
  }
  WithColor::~WithColor((WithColor *)local_58);
  if (this->LineNo == -1) {
    return;
  }
  if (this->ColumnNo == -1) {
    return;
  }
  psVar1 = &this->LineContents;
  pcVar18 = (psVar1->_M_dataplus)._M_p;
  uVar26 = (this->LineContents)._M_string_length;
  LineContents.Data = (psVar1->_M_dataplus)._M_p;
  LineContents.Length = psVar1->_M_string_length;
  pcVar3 = pcVar18 + uVar26;
  pcVar15 = pcVar18;
  if (0 < (long)uVar26 >> 2) {
    pcVar15 = pcVar18 + (uVar26 & 0xfffffffffffffffc);
    lVar22 = ((long)uVar26 >> 2) + 1;
    pcVar18 = pcVar18 + 3;
    do {
      if (pcVar18[-3] < '\0') {
        pcVar18 = pcVar18 + -3;
        goto LAB_00db6c31;
      }
      if (pcVar18[-2] < '\0') {
        pcVar18 = pcVar18 + -2;
        goto LAB_00db6c31;
      }
      if (pcVar18[-1] < '\0') {
        pcVar18 = pcVar18 + -1;
        goto LAB_00db6c31;
      }
      if (*pcVar18 < '\0') goto LAB_00db6c31;
      lVar22 = lVar22 + -1;
      pcVar18 = pcVar18 + 4;
    } while (1 < lVar22);
  }
  lVar22 = (long)pcVar3 - (long)pcVar15;
  if (lVar22 != 1) {
    if (lVar22 != 2) {
      pcVar18 = pcVar3;
      if ((lVar22 != 3) || (pcVar18 = pcVar15, *pcVar15 < '\0')) goto LAB_00db6c31;
      pcVar15 = pcVar15 + 1;
    }
    pcVar18 = pcVar15;
    if (*pcVar15 < '\0') goto LAB_00db6c31;
    pcVar15 = pcVar15 + 1;
  }
  pcVar18 = pcVar15;
  if (-1 < *pcVar15) {
    pcVar18 = pcVar3;
  }
LAB_00db6c31:
  if (pcVar18 == pcVar3) {
    local_58 = (undefined1  [8])&CaretLine._M_string_length;
    std::__cxx11::string::_M_construct((ulong)local_58,(char)uVar26 + '\x01');
    uVar11 = (ulong)((long)(this->Ranges).
                           super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->Ranges).
                          super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start) >> 3;
    CaretLine.field_2._8_8_ = this;
    if ((int)uVar11 != 0) {
      uVar25 = 0;
      do {
        uVar16 = (ulong)*(uint *)(*(long *)(CaretLine.field_2._8_8_ + 0x80) + uVar25 * 8);
        _Var19._M_p = (pointer)(ulong)*(uint *)(*(long *)(CaretLine.field_2._8_8_ + 0x80) + 4 +
                                               uVar25 * 8);
        if (CaretLine._M_dataplus._M_p < _Var19._M_p) {
          _Var19._M_p = CaretLine._M_dataplus._M_p;
        }
        sVar20 = (long)_Var19._M_p - uVar16;
        if (sVar20 != 0) {
          memset((void *)((long)(_func_int ***)local_58 + uVar16),0x7e,sVar20);
        }
        uVar25 = uVar25 + 1;
      } while ((uVar11 & 0xffffffff) != uVar25);
    }
    local_98 = &FixItInsertionLine._M_string_length;
    FixItInsertionLine._M_dataplus._M_p = (pointer)0x0;
    FixItInsertionLine._M_string_length._0_1_ = 0;
    uVar23 = *(uint *)(CaretLine.field_2._8_8_ + 0xa0);
    if ((ulong)uVar23 != 0) {
      uVar25 = *(long *)(CaretLine.field_2._8_8_ + 8) -
               (long)*(int *)(CaretLine.field_2._8_8_ + 0x34);
      lVar22 = *(long *)(CaretLine.field_2._8_8_ + 0x68);
      lVar4 = *(long *)(CaretLine.field_2._8_8_ + 0x98);
      uVar11 = lVar22 + uVar25;
      lVar24 = 0;
      S_1.DisableColors = false;
      S_1._9_7_ = 0;
      do {
        FixItInsertionLine.field_2._8_8_ = *(undefined8 *)(lVar4 + 0x10 + lVar24);
        Chars.Length = 3;
        Chars.Data = "\n\r\t";
        sVar12 = StringRef::find_first_of
                           ((StringRef *)((long)&FixItInsertionLine.field_2 + 8),Chars,0);
        if (sVar12 == 0xffffffffffffffff) {
          uVar16 = *(ulong *)(lVar4 + lVar24);
          uVar5 = *(ulong *)(lVar4 + 8 + lVar24);
          if (uVar25 <= uVar5 && uVar16 <= uVar11) {
            uVar10 = (int)uVar16 - (int)uVar25;
            if (uVar16 < uVar25) {
              uVar10 = 0;
            }
            uVar16 = (ulong)uVar10;
            uVar7 = S_1._8_4_ + 1;
            if ((ulong)S_1._8_8_ <= uVar16) {
              uVar7 = uVar10;
            }
            uVar10 = *(int *)(lVar4 + 0x18 + lVar24) + uVar7;
            S_1._8_8_ = ZEXT48(uVar10);
            if (FixItInsertionLine._M_dataplus._M_p < (ulong)S_1._8_8_) {
              std::__cxx11::string::resize((ulong)&local_98,(char)uVar10);
            }
            sVar20 = *(size_t *)(lVar4 + 0x18 + lVar24);
            if (sVar20 != 0) {
              memmove((void *)((ulong)uVar7 + (long)local_98),*(void **)(lVar4 + 0x10 + lVar24),
                      sVar20);
            }
            uVar10 = (int)uVar5 - (int)uVar25;
            if (uVar11 <= uVar5) {
              uVar10 = (uint)lVar22;
            }
            if (uVar10 - uVar16 != 0) {
              memset((void *)((long)(_func_int ***)local_58 + uVar16),0x7e,uVar10 - uVar16);
            }
          }
        }
        lVar24 = lVar24 + 0x30;
      } while ((ulong)uVar23 * 0x30 != lVar24);
    }
    uVar8 = CaretLine.field_2._8_8_;
    uVar11 = (long)(int)*(uint *)(CaretLine.field_2._8_8_ + 0x34);
    if (uVar26 < *(uint *)(CaretLine.field_2._8_8_ + 0x34)) {
      uVar11 = uVar26;
    }
    *(undefined1 *)((long)(_func_int ***)local_58 + uVar11) = 0x5e;
    lVar22 = std::__cxx11::string::find_last_not_of((char)local_58,0x20);
    pcVar13 = (pointer)(lVar22 + 1);
    if (CaretLine._M_dataplus._M_p < pcVar13) {
      std::__throw_out_of_range_fmt
                ("%s: __pos (which is %zu) > this->size() (which is %zu)","basic_string::erase",
                 pcVar13);
    }
    pcVar13[(long)(_func_int ***)local_58] = '\0';
    CaretLine._M_dataplus._M_p = pcVar13;
    printSourceLine(OS,*(StringRef *)(uVar8 + 0x60));
    pbVar17 = (byte *)0x0;
    FixItInsertionLine.field_2._8_8_ = OS;
    WithColor::changeColor((WithColor *)((long)&FixItInsertionLine.field_2 + 8),GREEN,true,false);
    uVar26 = (ulong)CaretLine._M_dataplus._M_p & 0xffffffff;
    pbVar21 = extraout_RDX_01;
    if (uVar26 != 0) {
      uVar11 = 0;
      uVar23 = 0;
      do {
        if ((uVar11 < *(ulong *)(CaretLine.field_2._8_8_ + 0x68)) &&
           (*(char *)(*(long *)(CaretLine.field_2._8_8_ + 0x60) + uVar11) == '\t')) {
          do {
            bVar2 = *(byte *)((long)(_func_int ***)local_58 + uVar11);
            pbVar17 = *(byte **)(FixItInsertionLine.field_2._8_8_ + 0x18);
            if (pbVar17 < *(byte **)(FixItInsertionLine.field_2._8_8_ + 0x10)) {
              pbVar21 = pbVar17 + 1;
              *(byte **)(FixItInsertionLine.field_2._8_8_ + 0x18) = pbVar21;
              *pbVar17 = bVar2;
            }
            else {
              raw_ostream::write((raw_ostream *)FixItInsertionLine.field_2._8_8_,(uint)bVar2,pbVar21
                                 ,(size_t)pbVar17);
              pbVar21 = extraout_RDX_02;
            }
            uVar23 = uVar23 + 1;
          } while ((uVar23 & 7) != 0);
        }
        else {
          bVar2 = *(byte *)((long)(_func_int ***)local_58 + uVar11);
          pbVar17 = *(byte **)(FixItInsertionLine.field_2._8_8_ + 0x18);
          if (pbVar17 < *(byte **)(FixItInsertionLine.field_2._8_8_ + 0x10)) {
            pbVar21 = pbVar17 + 1;
            *(byte **)(FixItInsertionLine.field_2._8_8_ + 0x18) = pbVar21;
            *pbVar17 = bVar2;
          }
          else {
            raw_ostream::write((raw_ostream *)FixItInsertionLine.field_2._8_8_,(uint)bVar2,pbVar21,
                               (size_t)pbVar17);
            pbVar21 = extraout_RDX_03;
          }
          uVar23 = uVar23 + 1;
        }
        uVar11 = uVar11 + 1;
      } while (uVar11 != uVar26);
    }
    puVar6 = *(undefined1 **)(FixItInsertionLine.field_2._8_8_ + 0x18);
    if (puVar6 < *(undefined1 **)(FixItInsertionLine.field_2._8_8_ + 0x10)) {
      *(undefined1 **)(FixItInsertionLine.field_2._8_8_ + 0x18) = puVar6 + 1;
      *puVar6 = 10;
    }
    else {
      raw_ostream::write((raw_ostream *)FixItInsertionLine.field_2._8_8_,10,pbVar21,(size_t)pbVar17)
      ;
    }
    WithColor::~WithColor((WithColor *)((long)&FixItInsertionLine.field_2 + 8));
    _Var19 = FixItInsertionLine._M_dataplus;
    if (FixItInsertionLine._M_dataplus._M_p != (pointer)0x0) {
      uVar26 = 0;
      pcVar13 = (pointer)0x0;
      pbVar21 = extraout_RDX_04;
      do {
        if ((pcVar13 < *(pointer *)(CaretLine.field_2._8_8_ + 0x68)) &&
           (pcVar13[*(long *)(CaretLine.field_2._8_8_ + 0x60)] == '\t')) {
          do {
            bVar2 = *(byte *)((long)local_98 + (long)pcVar13);
            pbVar17 = (byte *)OS->OutBufCur;
            if (pbVar17 < OS->OutBufEnd) {
              pbVar21 = pbVar17 + 1;
              OS->OutBufCur = (char *)pbVar21;
              *pbVar17 = bVar2;
            }
            else {
              raw_ostream::write(OS,(uint)bVar2,pbVar21,(size_t)pbVar17);
              pbVar21 = extraout_RDX_05;
            }
            pbVar17 = (byte *)(ulong)(*(char *)((long)local_98 + (long)pcVar13) != ' ');
            pcVar13 = pcVar13 + (long)pbVar17;
            uVar26 = uVar26 + 1;
          } while (((uVar26 & 7) != 0) && (pcVar13 != _Var19._M_p));
        }
        else {
          bVar2 = *(byte *)((long)local_98 + (long)pcVar13);
          pbVar17 = (byte *)OS->OutBufCur;
          if (pbVar17 < OS->OutBufEnd) {
            pbVar21 = pbVar17 + 1;
            OS->OutBufCur = (char *)pbVar21;
            *pbVar17 = bVar2;
          }
          else {
            raw_ostream::write(OS,(uint)bVar2,pbVar21,(size_t)pbVar17);
            pbVar21 = extraout_RDX_06;
          }
          uVar26 = uVar26 + 1;
        }
        pcVar13 = pcVar13 + 1;
      } while (pcVar13 < _Var19._M_p);
      pcVar18 = OS->OutBufCur;
      if (pcVar18 < OS->OutBufEnd) {
        OS->OutBufCur = pcVar18 + 1;
        *pcVar18 = '\n';
      }
      else {
        raw_ostream::write(OS,10,pbVar21,(size_t)pbVar17);
      }
    }
    if (local_98 != &FixItInsertionLine._M_string_length) {
      operator_delete(local_98,CONCAT71(FixItInsertionLine._M_string_length._1_7_,
                                        (undefined1)FixItInsertionLine._M_string_length) + 1);
    }
    if (local_58 != (undefined1  [8])&CaretLine._M_string_length) {
      operator_delete((void *)local_58,CaretLine._M_string_length + 1);
    }
  }
  else {
    printSourceLine(OS,LineContents);
  }
  return;
}

Assistant:

void SMDiagnostic::print(const char *ProgName, raw_ostream &OS,
                         bool ShowColors, bool ShowKindLabel) const {
  {
    WithColor S(OS, raw_ostream::SAVEDCOLOR, true, false, !ShowColors);

    if (ProgName && ProgName[0])
      S << ProgName << ": ";

    if (!Filename.empty()) {
      if (Filename == "-")
        S << "<stdin>";
      else
        S << Filename;

      if (LineNo != -1) {
        S << ':' << LineNo;
        if (ColumnNo != -1)
          S << ':' << (ColumnNo + 1);
      }
      S << ": ";
    }
  }

  if (ShowKindLabel) {
    switch (Kind) {
    case SourceMgr::DK_Error:
      WithColor::error(OS, "", !ShowColors);
      break;
    case SourceMgr::DK_Warning:
      WithColor::warning(OS, "", !ShowColors);
      break;
    case SourceMgr::DK_Note:
      WithColor::note(OS, "", !ShowColors);
      break;
    case SourceMgr::DK_Remark:
      WithColor::remark(OS, "", !ShowColors);
      break;
    }
  }

  WithColor(OS, raw_ostream::SAVEDCOLOR, true, false, !ShowColors)
      << Message << '\n';

  if (LineNo == -1 || ColumnNo == -1)
    return;

  // FIXME: If there are multibyte or multi-column characters in the source, all
  // our ranges will be wrong. To do this properly, we'll need a byte-to-column
  // map like Clang's TextDiagnostic. For now, we'll just handle tabs by
  // expanding them later, and bail out rather than show incorrect ranges and
  // misaligned fixits for any other odd characters.
  if (find_if(LineContents, isNonASCII) != LineContents.end()) {
    printSourceLine(OS, LineContents);
    return;
  }
  size_t NumColumns = LineContents.size();

  // Build the line with the caret and ranges.
  std::string CaretLine(NumColumns+1, ' ');

  // Expand any ranges.
  for (unsigned r = 0, e = Ranges.size(); r != e; ++r) {
    std::pair<unsigned, unsigned> R = Ranges[r];
    std::fill(&CaretLine[R.first],
              &CaretLine[std::min((size_t)R.second, CaretLine.size())],
              '~');
  }

  // Add any fix-its.
  // FIXME: Find the beginning of the line properly for multibyte characters.
  std::string FixItInsertionLine;
  buildFixItLine(CaretLine, FixItInsertionLine, FixIts,
                 makeArrayRef(Loc.getPointer() - ColumnNo,
                              LineContents.size()));

  // Finally, plop on the caret.
  if (unsigned(ColumnNo) <= NumColumns)
    CaretLine[ColumnNo] = '^';
  else
    CaretLine[NumColumns] = '^';

  // ... and remove trailing whitespace so the output doesn't wrap for it.  We
  // know that the line isn't completely empty because it has the caret in it at
  // least.
  CaretLine.erase(CaretLine.find_last_not_of(' ')+1);

  printSourceLine(OS, LineContents);

  {
    WithColor S(OS, raw_ostream::GREEN, true, false, !ShowColors);

    // Print out the caret line, matching tabs in the source line.
    for (unsigned i = 0, e = CaretLine.size(), OutCol = 0; i != e; ++i) {
      if (i >= LineContents.size() || LineContents[i] != '\t') {
        S << CaretLine[i];
        ++OutCol;
        continue;
      }

      // Okay, we have a tab.  Insert the appropriate number of characters.
      do {
        S << CaretLine[i];
        ++OutCol;
      } while ((OutCol % TabStop) != 0);
    }
    S << '\n';
  }

  // Print out the replacement line, matching tabs in the source line.
  if (FixItInsertionLine.empty())
    return;

  for (size_t i = 0, e = FixItInsertionLine.size(), OutCol = 0; i < e; ++i) {
    if (i >= LineContents.size() || LineContents[i] != '\t') {
      OS << FixItInsertionLine[i];
      ++OutCol;
      continue;
    }

    // Okay, we have a tab.  Insert the appropriate number of characters.
    do {
      OS << FixItInsertionLine[i];
      // FIXME: This is trying not to break up replacements, but then to re-sync
      // with the tabs between replacements. This will fail, though, if two
      // fix-it replacements are exactly adjacent, or if a fix-it contains a
      // space. Really we should be precomputing column widths, which we'll
      // need anyway for multibyte chars.
      if (FixItInsertionLine[i] != ' ')
        ++i;
      ++OutCol;
    } while (((OutCol % TabStop) != 0) && i != e);
  }
  OS << '\n';
}